

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

String * __thiscall
doctest::toString<double>(String *__return_storage_ptr__,doctest *this,IsNaN<double> in)

{
  char *in_00;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  String local_38;
  String local_20;
  
  in_00 = "";
  if (((ulong)this & 1) != 0) {
    in_00 = "! ";
  }
  String::String(&local_50,in_00);
  String::String(&local_68,"IsNaN( ");
  operator+(&local_38,&local_50,&local_68);
  detail::toStreamLit<double>(&local_80,in.value);
  operator+(&local_20,&local_38,&local_80);
  String::String(&local_98," )");
  operator+(__return_storage_ptr__,&local_20,&local_98);
  String::~String(&local_98);
  String::~String(&local_20);
  String::~String(&local_80);
  String::~String(&local_38);
  String::~String(&local_68);
  String::~String(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }